

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

void __thiscall inja::Renderer::visit(Renderer *this,IncludeStatementNode *node)

{
  const_iterator cVar1;
  Renderer sub_renderer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  Renderer local_168;
  
  Renderer(&local_168,&this->config,this->template_storage,this->function_storage);
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
          ::find(&this->template_storage->_M_t,&node->file);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header) {
    if ((this->config).throw_at_missing_includes == true) {
      ::std::operator+(&bStack_1a8,"include \'",&node->file);
      ::std::operator+(&local_188,&bStack_1a8,"\' not found");
      throw_renderer_error(this,&local_188,(AstNode *)node);
      ::std::__cxx11::string::~string((string *)&local_188);
      ::std::__cxx11::string::~string((string *)&bStack_1a8);
    }
  }
  else {
    render_to(&local_168,this->output_stream,(Template *)(cVar1._M_node + 2),this->data_input,
              &this->additional_data);
  }
  ~Renderer(&local_168);
  return;
}

Assistant:

void visit(const IncludeStatementNode& node) {
    auto sub_renderer = Renderer(config, template_storage, function_storage);
    const auto included_template_it = template_storage.find(node.file);
    if (included_template_it != template_storage.end()) {
      sub_renderer.render_to(*output_stream, included_template_it->second, *data_input, &additional_data);
    } else if (config.throw_at_missing_includes) {
      throw_renderer_error("include '" + node.file + "' not found", node);
    }
  }